

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRProgram.h
# Opt level: O2

IRBuiltinFunction * __thiscall
flow::IRProgram::getBuiltinFunction(IRProgram *this,NativeCallback *cb)

{
  vector<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>_>_>
  *this_00;
  pointer puVar1;
  bool bVar2;
  Signature *this_01;
  Signature *v;
  pointer puVar3;
  long lVar4;
  long lVar5;
  undefined1 local_40 [16];
  
  puVar3 = (this->builtinFunctions_).
           super__Vector_base<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar1 = (this->builtinFunctions_).
           super__Vector_base<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = &this->builtinFunctions_;
  lVar5 = 0;
  lVar4 = 0;
  local_40._8_8_ = this;
  do {
    if ((long)puVar3 - (long)puVar1 >> 3 == lVar4) {
      std::make_unique<flow::IRBuiltinFunction,flow::NativeCallback_const&>
                ((NativeCallback *)local_40);
      std::
      vector<std::unique_ptr<flow::IRBuiltinFunction,std::default_delete<flow::IRBuiltinFunction>>,std::allocator<std::unique_ptr<flow::IRBuiltinFunction,std::default_delete<flow::IRBuiltinFunction>>>>
      ::
      emplace_back<std::unique_ptr<flow::IRBuiltinFunction,std::default_delete<flow::IRBuiltinFunction>>>
                ((vector<std::unique_ptr<flow::IRBuiltinFunction,std::default_delete<flow::IRBuiltinFunction>>,std::allocator<std::unique_ptr<flow::IRBuiltinFunction,std::default_delete<flow::IRBuiltinFunction>>>>
                  *)this_00,
                 (unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>
                  *)local_40);
      if ((Runtime *)local_40._0_8_ != (Runtime *)0x0) {
        (*(*(_func_int ***)local_40._0_8_)[1])();
      }
      puVar3 = (((vector<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>_>_>
                  *)(local_40._8_8_ + 0x148))->
               super__Vector_base<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish + -1;
LAB_00112926:
      return (puVar3->_M_t).
             super___uniq_ptr_impl<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>
             ._M_t.
             super__Tuple_impl<0UL,_flow::IRBuiltinFunction_*,_std::default_delete<flow::IRBuiltinFunction>_>
             .super__Head_base<0UL,_flow::IRBuiltinFunction_*,_false>._M_head_impl;
    }
    this_01 = IRBuiltinFunction::signature
                        ((IRBuiltinFunction *)
                         (this_00->
                         super__Vector_base<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[lVar4]._M_t.
                         super___uniq_ptr_impl<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>
                        );
    v = NativeCallback::signature(cb);
    bVar2 = Signature::operator==(this_01,v);
    if (bVar2) {
      puVar3 = (pointer)((long)(this_00->
                               super__Vector_base<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start - lVar5);
      goto LAB_00112926;
    }
    lVar4 = lVar4 + 1;
    lVar5 = lVar5 + -8;
  } while( true );
}

Assistant:

IRBuiltinFunction* getBuiltinFunction(const NativeCallback& cb) {
    for (size_t i = 0, e = builtinFunctions_.size(); i != e; ++i)
      if (builtinFunctions_[i]->signature() == cb.signature())
        return builtinFunctions_[i].get();

    builtinFunctions_.emplace_back(std::make_unique<IRBuiltinFunction>(cb));
    return builtinFunctions_.back().get();
  }